

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void __thiscall
duckdb::ArgMinMaxBase<duckdb::LessThan,true>::
Combine<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::hugeint_t>,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
          (ArgMinMaxBase<duckdb::LessThan,true> *this,
          ArgMinMaxState<duckdb::string_t,_duckdb::hugeint_t> *source,
          ArgMinMaxState<duckdb::string_t,_duckdb::hugeint_t> *target,AggregateInputData *param_3)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  int64_t iVar5;
  undefined7 uVar6;
  string_t new_value;
  
  if (*this == (ArgMinMaxBase<duckdb::LessThan,true>)0x1) {
    if ((source->super_ArgMinMaxStateBase).is_initialized == true) {
      uVar1 = (source->value).lower;
      lVar2 = (source->value).upper;
      lVar3 = *(long *)(this + 0x20);
      uVar4 = *(ulong *)(this + 0x18);
      uVar6 = (undefined7)(uVar1 >> 8);
      param_3 = (AggregateInputData *)CONCAT71(uVar6,uVar4 < uVar1);
      if ((lVar2 <= lVar3) &&
         (param_3 = (AggregateInputData *)CONCAT71(uVar6,uVar4 < uVar1 && lVar2 == lVar3),
         uVar1 <= uVar4 || lVar2 != lVar3)) {
        return;
      }
    }
    new_value.value.pointer.ptr = (char *)param_3;
    new_value.value._0_8_ = *(undefined8 *)(this + 0x10);
    ArgMinMaxStateBase::AssignValue<duckdb::string_t>
              ((ArgMinMaxStateBase *)&source->arg,*(string_t **)(this + 8),new_value);
    iVar5 = *(int64_t *)(this + 0x20);
    (source->value).lower = *(uint64_t *)(this + 0x18);
    (source->value).upper = iVar5;
    (source->super_ArgMinMaxStateBase).is_initialized = true;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_initialized) {
			return;
		}
		if (!target.is_initialized || COMPARATOR::Operation(source.value, target.value)) {
			Assign(target, source.arg, source.value, source.arg_null);
			target.is_initialized = true;
		}
	}